

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AutoincrementEnd(Parse *pParse)

{
  int iVar1;
  Vdbe *p;
  sqlite3 *psVar2;
  Db *pDVar3;
  uint uVar4;
  uint uVar5;
  int p2;
  uint uVar6;
  byte bVar7;
  AutoincInfo *pAVar8;
  long lVar9;
  int p3;
  int iVar10;
  
  pAVar8 = pParse->pAinc;
  if (pAVar8 != (AutoincInfo *)0x0) {
    p = pParse->pVdbe;
    psVar2 = pParse->db;
    do {
      pDVar3 = psVar2->aDb;
      iVar1 = pAVar8->iDb;
      iVar10 = pAVar8->regCtr;
      if (pParse->nTempReg == '\0') {
        p3 = pParse->nMem + 1;
        pParse->nMem = p3;
      }
      else {
        bVar7 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar7;
        p3 = pParse->aTempReg[bVar7];
      }
      sqlite3OpenTable(pParse,0,iVar1,(pDVar3[iVar1].pSchema)->pSeqTab,0x28);
      iVar1 = iVar10 + 1;
      uVar4 = sqlite3VdbeAddOp3(p,0x4a,iVar1,0,0);
      uVar5 = sqlite3VdbeAddOp3(p,0x48,0,0,0);
      p2 = sqlite3VdbeAddOp3(p,0x1d,0,0,p3);
      iVar10 = iVar10 + -1;
      uVar6 = sqlite3VdbeAddOp3(p,0x4c,iVar10,0,p3);
      sqlite3VdbeAddOp3(p,0x5f,0,p2,0);
      if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
        p->aOp[uVar5].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x38,0,iVar1,0);
      uVar5 = sqlite3VdbeAddOp3(p,1,0,0,0);
      if ((-1 < (int)uVar6) && (uVar6 < (uint)p->nOp)) {
        p->aOp[uVar6].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x41,0,iVar1,0);
      if ((-1 < (int)uVar4) && (uVar4 < (uint)p->nOp)) {
        p->aOp[uVar4].p2 = p->nOp;
      }
      if ((-1 < (int)uVar5) && (uVar5 < (uint)p->nOp)) {
        p->aOp[uVar5].p2 = p->nOp;
      }
      sqlite3VdbeAddOp3(p,0x1f,iVar10,2,p3);
      sqlite3VdbeAddOp3(p,0x39,0,p3,iVar1);
      if (p->aOp != (Op *)0x0) {
        p->aOp[(long)p->nOp + -1].p5 = '\b';
      }
      sqlite3VdbeAddOp3(p,0x2d,0,0,0);
      if (p3 != 0) {
        bVar7 = pParse->nTempReg;
        if ((ulong)bVar7 < 8) {
          lVar9 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar9) == p3) {
              (&pParse->aColCache[0].tempReg)[lVar9] = '\x01';
              goto LAB_0019a65e;
            }
            lVar9 = lVar9 + 0x18;
          } while ((int)lVar9 != 0xf0);
          pParse->nTempReg = bVar7 + 1;
          pParse->aTempReg[bVar7] = p3;
        }
      }
LAB_0019a65e:
      pAVar8 = pAVar8->pNext;
    } while (pAVar8 != (AutoincInfo *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AutoincrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    Db *pDb = &db->aDb[p->iDb];
    int j1, j2, j3, j4, j5;
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    j1 = sqlite3VdbeAddOp1(v, OP_NotNull, memId+1);
    j2 = sqlite3VdbeAddOp0(v, OP_Rewind);
    j3 = sqlite3VdbeAddOp3(v, OP_Column, 0, 0, iRec);
    j4 = sqlite3VdbeAddOp3(v, OP_Eq, memId-1, 0, iRec);
    sqlite3VdbeAddOp2(v, OP_Next, 0, j3);
    sqlite3VdbeJumpHere(v, j2);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, memId+1);
    j5 = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, j4);
    sqlite3VdbeAddOp2(v, OP_Rowid, 0, memId+1);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3VdbeJumpHere(v, j5);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, memId-1, 2, iRec);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, iRec, memId+1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}